

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

int asciiToAscii(uchar *out,int *poutlen,uchar *in,int *pinlen,void *vctxt)

{
  uchar *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  iVar6 = (int)in;
  if (in == (uchar *)0x0) {
    iVar5 = 0;
    *pinlen = 0;
    *poutlen = 0;
  }
  else {
    iVar2 = *pinlen;
    iVar3 = *poutlen;
    iVar4 = iVar3;
    if (iVar2 <= iVar3) {
      iVar4 = iVar2;
    }
    iVar5 = -3;
    if (iVar2 <= iVar3) {
      iVar5 = iVar2;
    }
    puVar1 = in + iVar4;
    *poutlen = iVar4;
    *pinlen = iVar4;
    for (; in < puVar1; in = in + 1) {
      if ((char)*in < '\0') {
        iVar6 = (int)in - iVar6;
        *poutlen = iVar6;
        *pinlen = iVar6;
        return -2;
      }
      *out = *in;
      out = out + 1;
    }
  }
  return iVar5;
}

Assistant:

static int
asciiToAscii(unsigned char* out, int *poutlen,
             const unsigned char* in, int *pinlen,
             void *vctxt ATTRIBUTE_UNUSED) {
    const unsigned char *inend;
    const unsigned char *instart = in;
    int inlen, outlen, ret;

    if (in == NULL) {
        *pinlen = 0;
        *poutlen = 0;
        return(XML_ENC_ERR_SUCCESS);
    }

    inlen = *pinlen;
    outlen = *poutlen;

    if (outlen < inlen) {
        inlen = outlen;
        ret = XML_ENC_ERR_SPACE;
    } else {
        ret = inlen;
    }

    inend = in + inlen;
    *poutlen = inlen;
    *pinlen = inlen;

    while (in < inend) {
	unsigned c = *in;

        if (c >= 0x80) {
	    *poutlen = in - instart;
	    *pinlen = in - instart;
	    return(XML_ENC_ERR_INPUT);
	}

        in++;
	*out++ = c;
    }

    return(ret);
}